

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSIMDExtract(TranslateToFuzzReader *this,Type type)

{
  BasicType BVar1;
  Index IVar2;
  FeatureOptions<wasm::SIMDExtractOp> *pFVar3;
  SIMDExtract *pSVar4;
  uint8_t local_81;
  Type TStack_80;
  uint8_t index;
  Expression *local_78;
  Expression *vec;
  FeatureSet local_5c;
  FeatureOptions<wasm::SIMDExtractOp> local_58;
  SIMDExtractOp local_1c;
  TranslateToFuzzReader *pTStack_18;
  SIMDExtractOp op;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_1c = ExtractLaneSVecI8x16;
  pTStack_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  BVar1 = Type::getBasic((Type *)&this_local);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x11ab);
  case i32:
    local_1c = pick<wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp>
                         (this,ExtractLaneSVecI8x16,ExtractLaneUVecI8x16,ExtractLaneSVecI16x8,
                          ExtractLaneUVecI16x8,ExtractLaneVecI32x4);
    break;
  case i64:
    local_1c = ExtractLaneVecI64x2;
    break;
  case f32:
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_58.options._M_t._M_impl._0_8_ = 0;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    Random::FeatureOptions<wasm::SIMDExtractOp>::FeatureOptions(&local_58);
    FeatureSet::FeatureSet(&local_5c,8);
    pFVar3 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       (&local_58,local_5c,ExtractLaneVecF32x4);
    FeatureSet::FeatureSet((FeatureSet *)&vec,0x40000);
    pFVar3 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       (pFVar3,vec._0_4_,ExtractLaneVecF16x8);
    local_1c = pick<wasm::SIMDExtractOp>(this,pFVar3);
    Random::FeatureOptions<wasm::SIMDExtractOp>::~FeatureOptions(&local_58);
    break;
  case f64:
    local_1c = ExtractLaneVecF64x2;
  }
  Type::Type(&stack0xffffffffffffff80,v128);
  local_78 = make(this,TStack_80);
  local_81 = '\0';
  switch(local_1c) {
  case ExtractLaneSVecI8x16:
  case ExtractLaneUVecI8x16:
    IVar2 = upTo(this,0x10);
    local_81 = (uint8_t)IVar2;
    break;
  case ExtractLaneSVecI16x8:
  case ExtractLaneUVecI16x8:
  case ExtractLaneVecF16x8:
    IVar2 = upTo(this,8);
    local_81 = (uint8_t)IVar2;
    break;
  case ExtractLaneVecI32x4:
  case ExtractLaneVecF32x4:
    IVar2 = upTo(this,4);
    local_81 = (uint8_t)IVar2;
    break;
  case ExtractLaneVecI64x2:
  case ExtractLaneVecF64x2:
    IVar2 = upTo(this,2);
    local_81 = (uint8_t)IVar2;
  }
  pSVar4 = Builder::makeSIMDExtract(&this->builder,local_1c,local_78,local_81);
  return (Expression *)pSVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDExtract(Type type) {
  auto op = static_cast<SIMDExtractOp>(0);
  switch (type.getBasic()) {
    case Type::i32:
      op = pick(ExtractLaneSVecI8x16,
                ExtractLaneUVecI8x16,
                ExtractLaneSVecI16x8,
                ExtractLaneUVecI16x8,
                ExtractLaneVecI32x4);
      break;
    case Type::i64:
      op = ExtractLaneVecI64x2;
      break;
    case Type::f32:
      op = pick(FeatureOptions<SIMDExtractOp>()
                  .add(FeatureSet::SIMD, ExtractLaneVecF32x4)
                  .add(FeatureSet::FP16, ExtractLaneVecF16x8));
      break;
    case Type::f64:
      op = ExtractLaneVecF64x2;
      break;
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  Expression* vec = make(Type::v128);
  uint8_t index = 0;
  switch (op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
      index = upTo(16);
      break;
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecF16x8:
      index = upTo(8);
      break;
    case ExtractLaneVecI32x4:
    case ExtractLaneVecF32x4:
      index = upTo(4);
      break;
    case ExtractLaneVecI64x2:
    case ExtractLaneVecF64x2:
      index = upTo(2);
      break;
  }
  return builder.makeSIMDExtract(op, vec, index);
}